

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

void ActionStackPtrFlow::analyzeExtraPop(Funcdata *data,AddrSpace *stackspace,int4 spcbase)

{
  int iVar1;
  int4 s;
  PcodeOp *op;
  Varnode *pVVar2;
  ProtoModel *pPVar3;
  FuncCallSpecs *pFVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  Varnode *invn;
  StackSolver solver;
  vector<Varnode_*,_std::allocator<Varnode_*>_> paramlist;
  Varnode *local_260;
  Varnode *local_258 [4];
  StackSolver local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  pPVar3 = data->glb->evalfp_called;
  if (pPVar3 == (ProtoModel *)0x0) {
    pPVar3 = data->glb->defaultfp;
  }
  if (pPVar3->extrapop == 0x8000) {
    local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_238.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_238.spacebase.base = (AddrSpace *)0x0;
    StackSolver::build(&local_238,data,stackspace,spcbase);
    if ((int)((ulong)((long)local_238.vnlist.
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_238.vnlist.
                           super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) != 0) {
      StackSolver::solve(&local_238);
      local_258[0] = *local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      if (1 < (int)((ulong)((long)local_238.vnlist.
                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_238.vnlist.
                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3)) {
        lVar7 = 1;
        bVar6 = false;
        do {
          iVar1 = local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          if ((long)iVar1 == 0xffff) {
            if (!bVar6) {
              std::operator+(local_1a8,"Unable to track spacebase fully for ",&stackspace->name);
              Funcdata::warningHeader(data,local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p);
              }
              bVar6 = true;
            }
          }
          else {
            op = local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]->def;
            if (((op->opcode->opcode == CPUI_INDIRECT) &&
                (pVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[1],
                ((pVVar2->loc).base)->type == IPTR_IOP)) &&
               (pFVar4 = Funcdata::getCallSpecs(data,(PcodeOp *)(pVVar2->loc).offset),
               pFVar4 != (FuncCallSpecs *)0x0)) {
              if ((long)local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7] < 0) {
                iVar5 = 0;
              }
              else {
                iVar5 = local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]];
              }
              pFVar4->effective_extrapop = iVar1 - iVar5;
            }
            local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
            local_1a8[0]._M_string_length = 0;
            local_1a8[0].field_2._M_allocated_capacity = (Varnode **)0x0;
            std::vector<Varnode*,std::allocator<Varnode*>>::_M_realloc_insert<Varnode*const&>
                      ((vector<Varnode*,std::allocator<Varnode*>> *)local_1a8,(iterator)0x0,
                       local_258);
            s = local_258[0]->size;
            iVar5 = 8;
            if (s < 8) {
              iVar5 = s;
            }
            local_260 = Funcdata::newConstant(data,s,(long)iVar1 & uintbmasks[iVar5]);
            if (local_1a8[0]._M_string_length == local_1a8[0].field_2._M_allocated_capacity) {
              std::vector<Varnode*,std::allocator<Varnode*>>::_M_realloc_insert<Varnode*>
                        ((vector<Varnode*,std::allocator<Varnode*>> *)local_1a8,
                         (iterator)local_1a8[0]._M_string_length,&local_260);
            }
            else {
              *(Varnode **)local_1a8[0]._M_string_length = local_260;
              local_1a8[0]._M_string_length = local_1a8[0]._M_string_length + 8;
            }
            Funcdata::opSetOpcode(data,op,CPUI_INT_ADD);
            Funcdata::opSetAllInput
                      (data,op,(vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_1a8);
            if (local_1a8[0]._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_1a8[0]._M_dataplus._M_p);
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)local_238.vnlist.
                                             super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_238.vnlist.
                                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
    }
    if (local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_238.soln.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.companion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.vnlist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.guess.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.eqs.super__Vector_base<StackEqn,_std::allocator<StackEqn>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ActionStackPtrFlow::analyzeExtraPop(Funcdata &data,AddrSpace *stackspace,int4 spcbase)

{
  ProtoModel *myfp = data.getArch()->evalfp_called;
  if (myfp == (ProtoModel *)0)
    myfp = data.getArch()->defaultfp;
  if (myfp->getExtraPop()!=ProtoModel::extrapop_unknown) return;

  StackSolver solver;
  try {
    solver.build(data,stackspace,spcbase);
  } catch(LowlevelError &err) {
    ostringstream s;
    s << "Stack frame is not setup normally: " << err.explain;
    data.warningHeader(s.str());
    return;
  }
  if (solver.getNumVariables() == 0) return;
  solver.solve();		// Solve the equations
  
  Varnode *invn = solver.getVariable(0);
  bool warningprinted = false;

  for(int4 i=1;i<solver.getNumVariables();++i) {
    Varnode *vn = solver.getVariable(i);
    int4 soln = solver.getSolution(i);
    if (soln == 65535) {
      if (!warningprinted) {
	data.warningHeader("Unable to track spacebase fully for "+stackspace->getName());
	warningprinted = true;
      }
      continue;
    }
    PcodeOp *op = vn->getDef();

    if (op->code() == CPUI_INDIRECT) {
      Varnode *iopvn = op->getIn(1);
      if (iopvn->getSpace()->getType()==IPTR_IOP) {
	PcodeOp *iop = PcodeOp::getOpFromConst(iopvn->getAddr());
	FuncCallSpecs *fc = data.getCallSpecs(iop);
	if (fc != (FuncCallSpecs *)0) {
	  int4 soln2 = 0;
	  int4 comp = solver.getCompanion(i);
	  if (comp >= 0)
	    soln2 = solver.getSolution(comp);
	  fc->setEffectiveExtraPop(soln-soln2);
	}
      }
    }
    vector<Varnode *> paramlist;
    paramlist.push_back(invn);
    int4 sz = invn->getSize();
    paramlist.push_back(data.newConstant(sz,soln&calc_mask(sz)));
    data.opSetOpcode(op,CPUI_INT_ADD);
    data.opSetAllInput(op,paramlist);
  }
  return;
}